

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTestPackages.cpp
# Opt level: O1

int __thiscall gl4cts::GL44TestPackage::init(GL44TestPackage *this,EVP_PKEY_CTX *ctx)

{
  PackageContext *pPVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  LayoutBindingTests *this_00;
  SeparateShaderObjsTests *this_01;
  SampleShadingTests *this_02;
  SampleVariablesTests *this_03;
  ShaderMultisampleInterpolationTests *this_04;
  GPUShader5Tests *this_05;
  ExtParameters extParams;
  ExtParameters local_20;
  
  GL43TestPackage::init(&this->super_GL43TestPackage,ctx);
  pTVar2 = (TestNode *)operator_new(0x78);
  pPVar1 = *(PackageContext **)
            ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.super_GL41TestPackage.
                    super_GL40TestPackage.super_GL33TestPackage.super_GL32TestPackage.
                    super_GL31TestPackage + 0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,(pPVar1->m_context).m_testCtx,"shaders44",
             "Shading Language Tests");
  pTVar2[1]._vptr_TestNode = (_func_int **)pPVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_02109170;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  BufferStorageTests::BufferStorageTests
            ((BufferStorageTests *)pTVar2,
             &(*(PackageContext **)
                ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.super_GL41TestPackage.
                        super_GL40TestPackage.super_GL33TestPackage.super_GL32TestPackage.
                        super_GL31TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  EnhancedLayoutsTests::EnhancedLayoutsTests
            ((EnhancedLayoutsTests *)pTVar2,
             &(*(PackageContext **)
                ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.super_GL41TestPackage.
                        super_GL40TestPackage.super_GL33TestPackage.super_GL32TestPackage.
                        super_GL31TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_00 = (LayoutBindingTests *)operator_new(0x80);
  glcts::LayoutBindingTests::LayoutBindingTests
            (this_00,&(*(PackageContext **)
                        ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.
                                super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                                super_GL32TestPackage.super_GL31TestPackage + 0x78))->m_context,
             GLSL_VERSION_440);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar2 = (TestNode *)operator_new(0x78);
  MultiBindTests::MultiBindTests
            ((MultiBindTests *)pTVar2,
             &(*(PackageContext **)
                ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.super_GL41TestPackage.
                        super_GL40TestPackage.super_GL33TestPackage.super_GL32TestPackage.
                        super_GL31TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_01 = (SeparateShaderObjsTests *)operator_new(0x80);
  glcts::SeparateShaderObjsTests::SeparateShaderObjsTests
            (this_01,&(*(PackageContext **)
                        ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.
                                super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                                super_GL32TestPackage.super_GL31TestPackage + 0x78))->m_context,
             GLSL_VERSION_440);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (SampleShadingTests *)operator_new(0x80);
  glcts::SampleShadingTests::SampleShadingTests
            (this_02,&(*(PackageContext **)
                        ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.
                                super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                                super_GL32TestPackage.super_GL31TestPackage + 0x78))->m_context,
             GLSL_VERSION_440);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (SampleVariablesTests *)operator_new(0x80);
  deqp::SampleVariablesTests::SampleVariablesTests
            (this_03,&(*(PackageContext **)
                        ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.
                                super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                                super_GL32TestPackage.super_GL31TestPackage + 0x78))->m_context,
             GLSL_VERSION_440);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (ShaderMultisampleInterpolationTests *)operator_new(0x80);
  deqp::ShaderMultisampleInterpolationTests::ShaderMultisampleInterpolationTests
            (this_04,&(*(PackageContext **)
                        ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.
                                super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                                super_GL32TestPackage.super_GL31TestPackage + 0x78))->m_context,
             GLSL_VERSION_440);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  pTVar2 = (TestNode *)operator_new(0x78);
  glcts::ShaderTextureImageSamplesTests::ShaderTextureImageSamplesTests
            ((ShaderTextureImageSamplesTests *)pTVar2,
             &(*(PackageContext **)
                ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.super_GL41TestPackage.
                        super_GL40TestPackage.super_GL33TestPackage.super_GL32TestPackage.
                        super_GL31TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_20.glslVersion = GLSL_VERSION_440;
  local_20.extType = EXTENSIONTYPE_NONE;
  pTVar2 = (TestNode *)operator_new(0x80);
  glcts::GeometryShaderTests::GeometryShaderTests
            ((GeometryShaderTests *)pTVar2,
             &(*(PackageContext **)
                ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.super_GL41TestPackage.
                        super_GL40TestPackage.super_GL33TestPackage.super_GL32TestPackage.
                        super_GL31TestPackage + 0x78))->m_context,&local_20);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  this_05 = (GPUShader5Tests *)operator_new(0x88);
  glcts::GPUShader5Tests::GPUShader5Tests
            (this_05,&(*(PackageContext **)
                        ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.
                                super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                                super_GL32TestPackage.super_GL31TestPackage + 0x78))->m_context,
             &local_20);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  pTVar2 = (TestNode *)operator_new(0x80);
  glcts::TessellationShaderTests::TessellationShaderTests
            ((TessellationShaderTests *)pTVar2,
             &(*(PackageContext **)
                ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.super_GL41TestPackage.
                        super_GL40TestPackage.super_GL33TestPackage.super_GL32TestPackage.
                        super_GL31TestPackage + 0x78))->m_context,&local_20);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  glcts::TextureCubeMapArrayTests::TextureCubeMapArrayTests
            ((TextureCubeMapArrayTests *)pTVar2,
             &(*(PackageContext **)
                ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.super_GL41TestPackage.
                        super_GL40TestPackage.super_GL33TestPackage.super_GL32TestPackage.
                        super_GL31TestPackage + 0x78))->m_context,&local_20);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  glcts::TextureBorderClampTests::TextureBorderClampTests
            ((TextureBorderClampTests *)pTVar2,
             &(*(PackageContext **)
                ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.super_GL41TestPackage.
                        super_GL40TestPackage.super_GL33TestPackage.super_GL32TestPackage.
                        super_GL31TestPackage + 0x78))->m_context,&local_20);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  glcts::TextureBufferTests::TextureBufferTests
            ((TextureBufferTests *)pTVar2,
             &(*(PackageContext **)
                ((long)&(this->super_GL43TestPackage).super_GL42TestPackage.super_GL41TestPackage.
                        super_GL40TestPackage.super_GL33TestPackage.super_GL32TestPackage.
                        super_GL31TestPackage + 0x78))->m_context,&local_20);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void GL44TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	GL43TestPackage::init();

	try
	{
		addChild(new GL44ShaderTests(getContext()));
		addChild(new gl4cts::BufferStorageTests(getContext()));
		addChild(new gl4cts::EnhancedLayoutsTests(getContext()));
		addChild(new glcts::LayoutBindingTests(getContext(), glu::GLSL_VERSION_440));
		addChild(new gl4cts::MultiBindTests(getContext()));
		addChild(new glcts::SeparateShaderObjsTests(getContext(), glu::GLSL_VERSION_440));
		addChild(new glcts::SampleShadingTests(getContext(), glu::GLSL_VERSION_440));
		addChild(new deqp::SampleVariablesTests(getContext(), glu::GLSL_VERSION_440));
		addChild(new deqp::ShaderMultisampleInterpolationTests(getContext(), glu::GLSL_VERSION_440));
		addChild(new glcts::ShaderTextureImageSamplesTests(getContext()));

		glcts::ExtParameters extParams(glu::GLSL_VERSION_440, glcts::EXTENSIONTYPE_NONE);
		addChild(new glcts::GeometryShaderTests(getContext(), extParams));
		addChild(new glcts::GPUShader5Tests(getContext(), extParams));
		addChild(new glcts::TessellationShaderTests(getContext(), extParams));
		addChild(new glcts::TextureCubeMapArrayTests(getContext(), extParams));
		addChild(new glcts::TextureBorderClampTests(getContext(), extParams));
		addChild(new glcts::TextureBufferTests(getContext(), extParams));

		//addChild(new gl4cts::ContextFlushControl::Tests(getContext()));
	}
	catch (...)
	{
		// Destroy context.
		TestPackage::deinit();
		throw;
	}
}